

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cpp
# Opt level: O3

Code * __thiscall md::Code::jsr(Code *this,Param *target)

{
  int iVar1;
  int iVar2;
  uchar *puVar3;
  uchar local_41;
  uchar local_40;
  undefined7 uStack_3f;
  uchar *local_38;
  long local_30;
  
  iVar1 = (*target->_vptr_Param[1])(target);
  iVar2 = (**target->_vptr_Param)(target);
  iVar1 = iVar2 + iVar1 * 8 + 0x4e80;
  local_40 = (uchar)((uint)iVar1 >> 8);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,&local_40);
  local_40 = (uchar)iVar1;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,&local_40);
  (*target->_vptr_Param[2])(&local_40,target);
  puVar3 = (uchar *)CONCAT71(uStack_3f,local_40);
  if (puVar3 != local_38) {
    do {
      local_41 = *puVar3;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,&local_41);
      puVar3 = puVar3 + 1;
    } while (puVar3 != local_38);
    puVar3 = (uchar *)CONCAT71(uStack_3f,local_40);
  }
  if (puVar3 != (uchar *)0x0) {
    operator_delete(puVar3,local_30 - (long)puVar3);
  }
  return this;
}

Assistant:

Code& Code::jsr(const Param& target)
{
    uint16_t opcode = 0x4E80 + target.getMXn();
    this->add_opcode(opcode);
    this->add_bytes(target.getAdditionnalData());
    return *this;
}